

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TRef lj_record_idx(jit_State *J,RecordIndex *ix)

{
  int *piVar1;
  cTValue *ptr;
  double dVar2;
  byte bVar3;
  char cVar4;
  uint uVar5;
  IRIns *pIVar6;
  TRef *pTVar7;
  TValue *pTVar8;
  ushort uVar9;
  TRef TVar10;
  TRef TVar11;
  uint uVar12;
  int iVar13;
  BCReg func;
  cTValue *pcVar14;
  IRRef1 IVar15;
  ushort uVar16;
  uint uVar17;
  long lVar18;
  Node *n;
  ulong uVar19;
  ptrdiff_t nargs;
  GCtab *t;
  code *cont;
  ulong uVar20;
  ushort uVar21;
  IROpT IVar22;
  ulong uVar23;
  uint uVar24;
  bool bVar25;
  
  pTVar8 = &ix->keyv;
  ptr = (cTValue *)(J[-1].penalty + 0x38);
  TVar11 = ix->tab;
  do {
    if ((TVar11 & 0x1f000000) == 0xb000000) {
      uVar12 = (ix->keyv).field_2.it;
      if ((uVar12 == 0xffffffff) || ((uVar12 < 0xfffeffff && (NAN(pTVar8->n))))) {
        if (ix->val != 0) {
          lj_trace_err(J,LJ_TRERR_STORENN);
        }
        if ((ix->key & 0x8000) != 0) goto LAB_0012e5d8;
      }
      else {
LAB_0012e5d8:
        t = (GCtab *)(ulong)(ix->tabv).u32.lo;
        pcVar14 = lj_tab_get(J->L,t,pTVar8);
        ix->oldv = pcVar14;
        uVar12 = ix->key;
        if ((uVar12 >> 0x18 & 0x1e) - 0xe < 6) {
          dVar2 = pTVar8->n;
          uVar24 = (int)dVar2;
          if ((double)(int)dVar2 != dVar2) {
            uVar24 = 0x8000001;
          }
          if (NAN((double)(int)dVar2) || NAN(dVar2)) {
            uVar24 = 0x8000001;
          }
          if (0x8000000 < uVar24) {
            if ((short)uVar12 < 0) {
              if (t->asize != 0) {
                lj_trace_err(J,LJ_TRERR_NYITMIX);
              }
              (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130006;
              TVar11 = lj_opt_fold(J);
              TVar10 = lj_ir_kint(J,0);
              (J->fold).ins.field_0.ot = 0x893;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
              lj_opt_fold(J);
            }
            goto LAB_0012e809;
          }
          if ((uVar12 & 0x1f000000) == 0xe000000) {
            IVar15 = 0x226e;
            IVar22 = 0x5593;
            uVar17 = uVar12;
LAB_0012e656:
            (J->fold).ins.field_0.ot = IVar22;
            (J->fold).ins.field_0.op1 = (IRRef1)uVar17;
            (J->fold).ins.field_0.op2 = IVar15;
            TVar10 = lj_opt_fold(J);
            TVar11 = ix->tab;
          }
          else {
            pIVar6 = (J->cur).ir;
            uVar19 = (ulong)(uVar12 & 0xffff);
            bVar3 = *(byte *)((long)pIVar6 + uVar19 * 8 + 5);
            TVar10 = uVar12;
            if ((byte)(bVar3 - 0x35) < 2) {
              IVar15 = *(IRRef1 *)((long)pIVar6 + uVar19 * 8 + 2);
              if ((-1 < (long)(short)IVar15) &&
                 (-1 < (int)(pIVar6[(short)IVar15].field_1.op12 + 0x40000000))) {
                IVar22 = (ushort)bVar3 * 0x100 - 0xced;
                uVar17 = (uint)pIVar6[uVar19].field_0.op1;
                goto LAB_0012e656;
              }
            }
          }
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130006;
          TVar11 = lj_opt_fold(J);
          if (t->asize <= uVar24) {
            (J->fold).ins.field_0.ot = 0x693;
            (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
            (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
            lj_opt_fold(J);
            if (uVar24 == 0 && (uVar12 & 0x8000) == 0) {
              pcVar14 = lj_ir_k64_find(J,0);
              uVar12 = lj_ir_k64(J,IR_KNUM,pcVar14);
            }
            goto LAB_0012e809;
          }
          rec_idx_abc(J,TVar11,TVar10,t->asize);
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050004;
          TVar11 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x3805;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
LAB_0012e939:
          uVar12 = lj_opt_fold(J);
        }
        else {
LAB_0012e809:
          if (t->hmask != 0) {
            if ((uVar12 >> 0x18 & 0x1f) - 0xf < 5) {
              (J->fold).ins.field_0.op1 = (IRRef1)uVar12;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
              uVar12 = lj_opt_fold(J);
            }
            if ((((short)(IRRef1)uVar12 < 0) || (t->hmask == 0)) ||
               (uVar24 = *(int *)&ix->oldv - (t->node).ptr32,
               0x17ffe8 < uVar24 || t->hmask * 0x18 < uVar24)) {
              TVar11 = ix->tab;
              (J->fold).ins.field_0.ot = 0x3a05;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
              (J->fold).ins.field_0.op2 = (IRRef1)uVar12;
            }
            else {
              (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130007;
              TVar11 = lj_opt_fold(J);
              TVar10 = lj_ir_kint(J,t->hmask);
              (J->fold).ins.field_0.ot = 0x893;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
              lj_opt_fold(J);
              (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
              *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43050005;
              TVar11 = lj_opt_fold(J);
              TVar10 = lj_ir_kslot(J,uVar12,uVar24 / 0x18);
              (J->fold).ins.field_0.ot = 0x3985;
              (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
              (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
            }
            goto LAB_0012e939;
          }
          (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x43130007;
          TVar11 = lj_opt_fold(J);
          TVar10 = lj_ir_kint(J,0);
          (J->fold).ins.field_0.ot = 0x893;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          lj_opt_fold(J);
          uVar12 = lj_ir_kptr_(J,IR_KKPTR,ptr);
        }
        uVar21 = (ushort)uVar12;
        pIVar6 = (J->cur).ir;
        uVar19 = (ulong)uVar12 & 0xffff;
        cVar4 = *(char *)((long)pIVar6 + uVar19 * 8 + 5);
        if (cVar4 == '\x19') {
          pcVar14 = (cTValue *)(ulong)pIVar6[uVar19].field_1.op12;
        }
        else {
          pcVar14 = ix->oldv;
        }
        uVar24 = cVar4 == '8' ^ 0x41;
        uVar12 = ix->val;
        if (uVar12 != 0) {
          uVar17 = ix->key;
          uVar5 = *(uint *)((ulong)(ix->tabv).u32.lo + 0x10);
          uVar23 = (ulong)uVar5;
          if ((pcVar14->field_2).it != 0xffffffff) {
            uVar16 = J->chain[(ulong)uVar24 + 7];
            if ((uint)uVar16 <= (uint)uVar19) goto LAB_0012ed54;
            goto LAB_0012ecf9;
          }
          if ((ix->idxchain != 0) && (uVar5 != 0)) {
            uVar5 = J[-1].bpropcache[10].mode;
            uVar19 = (ulong)*(uint *)(uVar23 + 0x14) +
                     (ulong)(*(uint *)((ulong)uVar5 + 8) & *(uint *)(uVar23 + 0x1c)) * 0x18;
            do {
              if ((*(int *)(uVar19 + 0xc) == -5) && (*(uint *)(uVar19 + 8) == uVar5)) {
                if (*(int *)(uVar19 + 4) != -1) {
                  IVar22 = (ushort)(uVar24 << 8) | 0x80;
                  IVar15 = 0;
                  goto LAB_0012ea65;
                }
                break;
              }
              uVar19 = (ulong)*(uint *)(uVar19 + 0x10);
            } while (uVar19 != 0);
          }
          if (cVar4 == ':') {
            IVar22 = (ushort)(pcVar14 != ptr) << 8 | 0x885;
            TVar11 = lj_ir_kptr_(J,IR_KKPTR,ptr);
            IVar15 = (IRRef1)TVar11;
LAB_0012ea65:
            (J->fold).ins.field_0.ot = IVar22;
            (J->fold).ins.field_0.op1 = uVar21;
            (J->fold).ins.field_0.op2 = IVar15;
            lj_opt_fold(J);
          }
          if ((ix->idxchain != 0) && (iVar13 = lj_record_mm_lookup(J,ix,MM_newindex), iVar13 != 0))
          goto LAB_0012eb7c;
          if (pcVar14 != ptr) {
            bVar25 = (uVar12 & 0x1f000000) != 0 && (uVar17 >> 0x18 & 0x1f) - 4 < 9;
            goto LAB_0012ef0c;
          }
          uVar12 = ix->key;
          if ((uVar12 >> 0x18 & 0x1f) - 0xf < 5) {
            (J->fold).ins.field_0.op1 = (IRRef1)uVar12;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
            uVar12 = lj_opt_fold(J);
          }
          TVar11 = ix->tab;
          (J->fold).ins.field_0.ot = 0x3b05;
          (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
          (J->fold).ins.field_0.op2 = (IRRef1)uVar12;
          TVar11 = lj_opt_fold(J);
          uVar21 = (ushort)TVar11;
          goto LAB_0012edf2;
        }
        uVar12 = (pcVar14->field_2).it;
        uVar17 = ~uVar12;
        if ((uVar12 & 0xffff8000) == 0xffff0000) {
          uVar17 = 3;
        }
        if (uVar12 < 0xfffeffff) {
          uVar17 = 0xe;
        }
        if (pcVar14 == ptr) {
          TVar11 = lj_ir_kptr_(J,IR_KKPTR,ptr);
          (J->fold).ins.field_0.ot = 0x885;
          (J->fold).ins.field_0.op1 = uVar21;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
          lj_opt_fold(J);
          TVar11 = 0x7fff;
        }
        else {
          (J->fold).ins.field_0.ot = (ushort)(uVar24 << 8) | (ushort)uVar17 | 0x80;
          (J->fold).ins.field_0.op1 = uVar21;
          (J->fold).ins.field_0.op2 = 0;
          TVar11 = lj_opt_fold(J);
        }
        if (uVar17 != 0) {
          if (uVar17 < 3) {
            return uVar17 * 0xffffff + 0x7fff;
          }
          return TVar11;
        }
      }
      if (ix->idxchain == 0) {
        return 0x7fff;
      }
      iVar13 = lj_record_mm_lookup(J,ix,MM_index);
      if (iVar13 == 0) {
        return 0x7fff;
      }
    }
    else {
      iVar13 = lj_record_mm_lookup(J,ix,(uint)(ix->val != 0));
      if (iVar13 == 0) {
        lj_trace_err(J,LJ_TRERR_NOMM);
      }
    }
LAB_0012eb7c:
    TVar11 = ix->mobj;
    if ((TVar11 & 0x1f000000) == 0x8000000) {
      cont = lj_cont_nop;
      if (ix->val == 0) {
        cont = lj_cont_ra;
      }
      func = rec_mm_prep(J,cont);
      pTVar7 = J->base;
      uVar19 = (ulong)func;
      pTVar8 = J->L->base;
      pTVar7[uVar19] = ix->mobj;
      pTVar7[uVar19 + 1] = ix->tab;
      pTVar7[uVar19 + 2] = ix->key;
      pTVar8[uVar19].field_2.field_0 = (ix->mobjv).field_2.field_0;
      *(undefined4 *)((long)pTVar8 + uVar19 * 8 + 4) = 0xfffffff7;
      pTVar8[uVar19 + 1].field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)ix->tabv;
      pTVar8[uVar19 + 2] = ix->keyv;
      if (ix->val == 0) {
        nargs = 2;
      }
      else {
        pTVar7[uVar19 + 3] = ix->val;
        pTVar8[uVar19 + 3] = ix->valv;
        nargs = 3;
      }
      rec_call_setup(J,func,nargs);
      J->framedepth = J->framedepth + 1;
      J->base = J->base + uVar19 + 1;
      J->baseslot = J->baseslot + func + 1;
      return 0;
    }
    ix->tab = TVar11;
    ix->tabv = ix->mobjv;
    piVar1 = &ix->idxchain;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      lj_trace_err(J,LJ_TRERR_IDXLOOP);
    }
  } while( true );
LAB_0012edeb:
  if ((*(byte *)((long)pIVar6 + uVar20 * 8 + 4) & 0x1f) != 0) {
LAB_0012edf2:
    bVar25 = false;
    goto LAB_0012ef0c;
  }
  goto LAB_0012edfa;
  while( true ) {
    if ((*(byte *)((long)pIVar6 + uVar20 * 8 + 4) & 0x1f) == 0) {
      uVar16 = *(ushort *)((long)pIVar6 + (ulong)pIVar6[uVar20].field_0.op1 * 8 + 2);
      uVar9 = *(ushort *)((long)pIVar6 + uVar19 * 8 + 2);
      if (((cVar4 == '8') ||
          (((*(byte *)((long)pIVar6 + (ulong)uVar9 * 8 + 4) ^
            *(byte *)((long)pIVar6 + (ulong)uVar16 * 8 + 4)) & 0x1f) == 0)) &&
         ((uVar16 == uVar9 || ((short)(uVar16 | uVar9) < 0)))) goto LAB_0012edfa;
    }
    uVar16 = *(ushort *)((long)pIVar6 + uVar20 * 8 + 6);
    if (uVar16 <= uVar21) break;
LAB_0012ecf9:
    uVar20 = (ulong)uVar16;
    if (pIVar6[uVar20].field_0.op1 == uVar21) goto LAB_0012edeb;
  }
LAB_0012ed54:
  uVar16 = J->chain[uVar24];
  if ((uint)uVar19 < (uint)uVar16) {
    do {
      uVar20 = (ulong)uVar16;
      if (pIVar6[uVar20].field_0.op1 == uVar21) goto LAB_0012edeb;
      uVar16 = *(ushort *)((long)pIVar6 + uVar20 * 8 + 6);
    } while (uVar21 < uVar16);
  }
LAB_0012edfa:
  if (cVar4 == ':') {
    TVar11 = lj_ir_kptr_(J,IR_KKPTR,ptr);
    (J->fold).ins.field_0.ot = 0x985;
    (J->fold).ins.field_0.op1 = uVar21;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar11;
    lj_opt_fold(J);
  }
  bVar25 = (uVar12 & 0x1f000000) != 0 && (uVar17 >> 0x18 & 0x1f) - 4 < 9;
  if (ix->idxchain != 0) {
    if (uVar23 == 0) {
      (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x430b0003;
      TVar11 = lj_opt_fold(J);
      TVar10 = lj_ir_knull(J,IRT_TAB);
      (J->fold).ins.field_0.ot = 0x88b;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
    }
    else {
      uVar12 = (pcVar14->field_2).it;
      uVar16 = 0x83;
      if ((uVar12 & 0xffff8000) != 0xffff0000) {
        uVar16 = ~(ushort)uVar12 | 0x80;
      }
      uVar9 = 0x8e;
      if (0xfffefffe < uVar12) {
        uVar9 = uVar16;
      }
      (J->fold).ins.field_0.ot = uVar9 | (ushort)(uVar24 << 8);
      (J->fold).ins.field_0.op1 = uVar21;
      (J->fold).ins.field_0.op2 = 0;
    }
    lj_opt_fold(J);
  }
LAB_0012ef0c:
  uVar12 = ix->val;
  uVar17 = uVar12 >> 0x18 & 0x1f;
  if (uVar17 - 0xf < 5) {
    (J->fold).ins.field_0.op1 = (IRRef1)uVar12;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x550e01d3;
    uVar12 = lj_opt_fold(J);
    ix->val = uVar12;
    uVar17 = uVar12 >> 0x18 & 0x1f;
  }
  (J->fold).ins.field_0.ot = (short)uVar17 + (short)(uVar24 << 8) + 0x700;
  (J->fold).ins.field_0.op1 = uVar21;
  (J->fold).ins.field_0.op2 = (IRRef1)uVar12;
  lj_opt_fold(J);
  if ((bVar25) || ((*(byte *)((long)&ix->val + 3) & 0x1f) - 4 < 9)) {
    (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x52000000;
    lj_opt_fold(J);
  }
  uVar12 = ix->key;
  if ((uVar12 & 0x1f000000) == 0x4000000) {
    if ((short)uVar12 < 0) {
LAB_0012efe4:
      (J->fold).ins.field_0.op1 = (IRRef1)ix->tab;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x3e050008;
      TVar11 = lj_opt_fold(J);
      TVar10 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x4a10;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar11;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
      lj_opt_fold(J);
    }
    else {
      lVar18 = 0;
      do {
        if (*(IRRef2 *)((long)J + lVar18 * 4 + -0x98) == (J->cur).ir[uVar12 & 0x7fff].field_1.op12)
        goto LAB_0012efe4;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 6);
    }
  }
  J->needsnap = '\x01';
  return 0;
}

Assistant:

TRef lj_record_idx(jit_State *J, RecordIndex *ix)
{
  TRef xref;
  IROp xrefop, loadop;
  cTValue *oldv;

  while (!tref_istab(ix->tab)) { /* Handle non-table lookup. */
    /* Never call raw lj_record_idx() on non-table. */
    lua_assert(ix->idxchain != 0);
    if (!lj_record_mm_lookup(J, ix, ix->val ? MM_newindex : MM_index))
      lj_trace_err(J, LJ_TRERR_NOMM);
  handlemm:
    if (tref_isfunc(ix->mobj)) {  /* Handle metamethod call. */
      BCReg func = rec_mm_prep(J, ix->val ? lj_cont_nop : lj_cont_ra);
      TRef *base = J->base + func;
      TValue *tv = J->L->base + func;
      base[0] = ix->mobj; base[1] = ix->tab; base[2] = ix->key;
      setfuncV(J->L, tv+0, funcV(&ix->mobjv));
      copyTV(J->L, tv+1, &ix->tabv);
      copyTV(J->L, tv+2, &ix->keyv);
      if (ix->val) {
	base[3] = ix->val;
	copyTV(J->L, tv+3, &ix->valv);
	lj_record_call(J, func, 3);  /* mobj(tab, key, val) */
	return 0;
      } else {
	lj_record_call(J, func, 2);  /* res = mobj(tab, key) */
	return 0;  /* No result yet. */
      }
    }
    /* Otherwise retry lookup with metaobject. */
    ix->tab = ix->mobj;
    copyTV(J->L, &ix->tabv, &ix->mobjv);
    if (--ix->idxchain == 0)
      lj_trace_err(J, LJ_TRERR_IDXLOOP);
  }

  /* First catch nil and NaN keys for tables. */
  if (tvisnil(&ix->keyv) || (tvisnum(&ix->keyv) && tvisnan(&ix->keyv))) {
    if (ix->val)  /* Better fail early. */
      lj_trace_err(J, LJ_TRERR_STORENN);
    if (tref_isk(ix->key)) {
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
	goto handlemm;
      return TREF_NIL;
    }
  }

  /* Record the key lookup. */
  xref = rec_idx_key(J, ix);
  xrefop = IR(tref_ref(xref))->o;
  loadop = xrefop == IR_AREF ? IR_ALOAD : IR_HLOAD;
  /* The lj_meta_tset() inconsistency is gone, but better play safe. */
  oldv = xrefop == IR_KKPTR ? (cTValue *)ir_kptr(IR(tref_ref(xref))) : ix->oldv;

  if (ix->val == 0) {  /* Indexed load */
    IRType t = itype2irt(oldv);
    TRef res;
    if (oldv == niltvg(J2G(J))) {
      emitir(IRTG(IR_EQ, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      res = TREF_NIL;
    } else {
      res = emitir(IRTG(loadop, t), xref, 0);
    }
    if (t == IRT_NIL && ix->idxchain && lj_record_mm_lookup(J, ix, MM_index))
      goto handlemm;
    if (irtype_ispri(t)) res = TREF_PRI(t);  /* Canonicalize primitives. */
    return res;
  } else {  /* Indexed store. */
    GCtab *mt = tabref(tabV(&ix->tabv)->metatable);
    int keybarrier = tref_isgcv(ix->key) && !tref_isnil(ix->val);
    if (tvisnil(oldv)) {  /* Previous value was nil? */
      /* Need to duplicate the hasmm check for the early guards. */
      int hasmm = 0;
      if (ix->idxchain && mt) {
	cTValue *mo = lj_tab_getstr(mt, mmname_str(J2G(J), MM_newindex));
	hasmm = mo && !tvisnil(mo);
      }
      if (hasmm)
	emitir(IRTG(loadop, IRT_NIL), xref, 0);  /* Guard for nil value. */
      else if (xrefop == IR_HREF)
	emitir(IRTG(oldv == niltvg(J2G(J)) ? IR_EQ : IR_NE, IRT_P32),
	       xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain && lj_record_mm_lookup(J, ix, MM_newindex)) {
	lua_assert(hasmm);
	goto handlemm;
      }
      lua_assert(!hasmm);
      if (oldv == niltvg(J2G(J))) {  /* Need to insert a new key. */
	TRef key = ix->key;
	if (tref_isinteger(key))  /* NEWREF needs a TValue as a key. */
	  key = emitir(IRTN(IR_CONV), key, IRCONV_NUM_INT);
	xref = emitir(IRT(IR_NEWREF, IRT_P32), ix->tab, key);
	keybarrier = 0;  /* NEWREF already takes care of the key barrier. */
      }
    } else if (!lj_opt_fwd_wasnonnil(J, loadop, tref_ref(xref))) {
      /* Cannot derive that the previous value was non-nil, must do checks. */
      if (xrefop == IR_HREF)  /* Guard against store to niltv. */
	emitir(IRTG(IR_NE, IRT_P32), xref, lj_ir_kkptr(J, niltvg(J2G(J))));
      if (ix->idxchain) {  /* Metamethod lookup required? */
	/* A check for NULL metatable is cheaper (hoistable) than a load. */
	if (!mt) {
	  TRef mtref = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
	  emitir(IRTG(IR_EQ, IRT_TAB), mtref, lj_ir_knull(J, IRT_TAB));
	} else {
	  IRType t = itype2irt(oldv);
	  emitir(IRTG(loadop, t), xref, 0);  /* Guard for non-nil value. */
	}
      }
    } else {
      keybarrier = 0;  /* Previous non-nil value kept the key alive. */
    }
    /* Convert int to number before storing. */
    if (!LJ_DUALNUM && tref_isinteger(ix->val))
      ix->val = emitir(IRTN(IR_CONV), ix->val, IRCONV_NUM_INT);
    emitir(IRT(loadop+IRDELTA_L2S, tref_type(ix->val)), xref, ix->val);
    if (keybarrier || tref_isgcv(ix->val))
      emitir(IRT(IR_TBAR, IRT_NIL), ix->tab, 0);
    /* Invalidate neg. metamethod cache for stores with certain string keys. */
    if (!nommstr(J, ix->key)) {
      TRef fref = emitir(IRT(IR_FREF, IRT_P32), ix->tab, IRFL_TAB_NOMM);
      emitir(IRT(IR_FSTORE, IRT_U8), fref, lj_ir_kint(J, 0));
    }
    J->needsnap = 1;
    return 0;
  }
}